

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O3

void freeattr(attr *a)

{
  int iVar1;
  field_t *pfVar2;
  struct_t *__ptr;
  field_t *__ptr_00;
  
  iVar1 = a->kind;
  if (iVar1 == 1) {
    freeattr(((a->field_1).array)->type);
  }
  else {
    if (iVar1 != 2) {
      if (iVar1 == 3) {
        freeattr(((a->field_1).function)->return_type);
        freearg(((a->field_1).function)->arg_list);
        free((a->field_1).basic);
      }
      abort();
    }
    __ptr = (a->field_1).structure;
    __ptr_00 = __ptr->field;
    if (__ptr_00 == (field_t *)0x0) goto LAB_00106e00;
    do {
      freeattr(__ptr_00->type);
      pfVar2 = __ptr_00->next;
      free(__ptr_00);
      __ptr_00 = pfVar2;
    } while (pfVar2 != (field_t *)0x0);
  }
  __ptr = (struct_t *)(a->field_1).basic;
LAB_00106e00:
  free(__ptr);
  return;
}

Assistant:

void freeattr(struct attr *a) {
    switch (a->kind) {
        case ARRAY:
            freeattr(a->array->type);
            free(a->array);
            break;
        case STRUCTURE:
            freefield(a->structure->field);
            free(a->structure);
            break;
        case FUNCTION:
            freeattr(a->function->return_type);
            freearg(a->function->arg_list);
            free(a->function);
        default:
            abort();
    }
}